

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trend_suite.cpp
# Opt level: O1

void double_suite::test_linear_increase_offset(void)

{
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  double *in_stack_ffffffffffffffb8;
  double local_40;
  char local_38 [8];
  
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '$';
  local_38[7] = '@';
  local_40 = 10.0;
  predicate.absolute = 2.2250738585072014e-308;
  predicate.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","10.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x54,0x105148,local_38,&local_40,in_stack_ffffffffffffffb8,predicate);
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '&';
  local_38[7] = '@';
  local_40 = 11.0;
  predicate_00.absolute = 2.2250738585072014e-308;
  predicate_00.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","11.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x56,0x105148,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_00);
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '(';
  local_38[7] = '@';
  local_40 = 12.0;
  predicate_01.absolute = 2.2250738585072014e-308;
  predicate_01.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","12.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x58,0x105148,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_01);
  return;
}

Assistant:

void test_linear_increase_offset()
{
    const auto tolerance = detail::close_to<double>(1e-5);
    cumulative::trend<double> filter;

    filter.push(10.0);
    TRIAL_TEST_WITH(filter.value(), 10.0, tolerance);
    filter.push(11.0);
    TRIAL_TEST_WITH(filter.value(), 11.0, tolerance);
    filter.push(12.0);
    TRIAL_TEST_WITH(filter.value(), 12.0, tolerance);
}